

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *p,int fUseAssign)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Vec_Str_t *pVVar5;
  Vec_Str_t *pVVar6;
  int *piVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  int i_16;
  long lVar20;
  char cVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int i_5;
  uint uVar25;
  Bac_Ntk_t *pBVar26;
  int i_3;
  size_t sVar27;
  int i;
  long lVar28;
  ulong uVar29;
  long lVar30;
  uint local_74;
  int local_5c;
  long local_50;
  
  uVar25 = (p->vType).nSize;
  uVar29 = (ulong)uVar25;
  if (0 < (int)uVar25) {
    pVVar5 = p->pDesign->vOut;
    local_50 = 1;
    local_5c = -1;
    pcVar18 = (char *)0x0;
    do {
      pcVar12 = (p->vType).pArray;
      bVar2 = pcVar12[(long)pcVar18];
      bVar9 = bVar2 >> 1;
      uVar25 = (uint)bVar9;
      if ((byte)(bVar2 - 0x14) < 0xf8 && uVar25 - 5 < 0x44) {
        uVar24 = (ulong)bVar2 & 0xfffffffffffffffe;
        cVar21 = (char)uVar24;
        iVar16 = (int)pcVar18;
        if (cVar21 == 'x') {
          if (bVar2 < 10) {
LAB_003a0206:
            pcVar18 = "!Bac_ObjIsBox(p, i)";
            pcVar13 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h";
            pcVar12 = "int Bac_BoxNtkId(Bac_Ntk_t *, int)";
LAB_003a021b:
            __assert_fail(pcVar18 + 1,pcVar13,0x13d,pcVar12);
          }
          if ((long)(p->vFanin).nSize <= (long)pcVar18) {
LAB_003a018a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pVVar6 = p->pDesign->vOut;
          pcVar12 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[(long)pcVar18]);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar12,(char *)0x0);
          lVar28 = 0;
          do {
            cVar21 = "\nmodule %s (\n  "[lVar28 + 0xd];
            uVar25 = pVVar6->nCap;
            if (pVVar6->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar13 = (char *)malloc(0x10);
                }
                else {
                  pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039d7df;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar13 = (char *)malloc(sVar19);
                }
                else {
                  pcVar13 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar13;
              pVVar6->nCap = (int)sVar19;
            }
LAB_0039d7df:
            iVar10 = pVVar6->nSize;
            pVVar6->nSize = iVar10 + 1;
            pVVar6->pArray[iVar10] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 2);
          sVar19 = strlen(pcVar12);
          if (0 < (int)(uint)sVar19) {
            uVar29 = 0;
            do {
              cVar21 = pcVar12[uVar29];
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar27 = 0x10;
                }
                else {
                  sVar27 = (ulong)uVar25 * 2;
                  if ((int)sVar27 <= (int)uVar25) goto LAB_0039d8e5;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar27);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,sVar27);
                  }
                }
                pVVar6->pArray = pcVar13;
                pVVar6->nCap = (int)sVar27;
              }
LAB_0039d8e5:
              iVar10 = pVVar6->nSize;
              pVVar6->nSize = iVar10 + 1;
              pVVar6->pArray[iVar10] = cVar21;
              uVar29 = uVar29 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar29);
          }
          uVar25 = pVVar6->nCap;
          if (pVVar6->nSize == uVar25) {
            if ((int)uVar25 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar25 * 2;
              if ((int)sVar19 <= (int)uVar25) goto LAB_0039dfcf;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(sVar19);
              }
              else {
                pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
              }
            }
            pVVar6->pArray = pcVar12;
            pVVar6->nCap = (int)sVar19;
          }
LAB_0039dfcf:
          iVar10 = pVVar6->nSize;
          pVVar6->nSize = iVar10 + 1;
          pVVar6->pArray[iVar10] = ' ';
          iVar10 = Bac_ObjName(p,iVar16);
          pcVar12 = "";
          if (iVar10 != 0) {
            pcVar12 = Bac_ObjNameStr(p,iVar16);
          }
          sVar19 = strlen(pcVar12);
          if (0 < (int)(uint)sVar19) {
            uVar29 = 0;
            do {
              cVar21 = pcVar12[uVar29];
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar27 = 0x10;
                }
                else {
                  sVar27 = (ulong)uVar25 * 2;
                  if ((int)sVar27 <= (int)uVar25) goto LAB_0039e08d;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar27);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,sVar27);
                  }
                }
                pVVar6->pArray = pcVar13;
                pVVar6->nCap = (int)sVar27;
              }
LAB_0039e08d:
              iVar10 = pVVar6->nSize;
              pVVar6->nSize = iVar10 + 1;
              pVVar6->pArray[iVar10] = cVar21;
              uVar29 = uVar29 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar29);
          }
          lVar28 = 0;
          do {
            cVar21 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar28 + 0x24];
            uVar25 = pVVar6->nCap;
            if (pVVar6->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039e11f;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar12;
              pVVar6->nCap = (int)sVar19;
            }
LAB_0039e11f:
            iVar10 = pVVar6->nSize;
            pVVar6->nSize = iVar10 + 1;
            pVVar6->pArray[iVar10] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 2);
          if (pcVar18 != (char *)0x0) {
            iVar10 = 1;
            if (1 < iVar16) {
              iVar10 = iVar16;
            }
            iVar16 = 0;
            pcVar12 = pcVar18;
            do {
              if ((p->vType).nSize < (int)pcVar12) goto LAB_003a011b;
              pcVar12 = pcVar12 + -1;
              if (((p->vType).pArray[(ulong)pcVar12 & 0xffffffff] & 0xfeU) != 6) break;
              pcVar13 = ", .";
              if (iVar16 == 0) {
                pcVar13 = ".";
              }
              lVar28 = 0;
              do {
                cVar21 = pcVar13[lVar28];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar14 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar14 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039e210;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar14 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar14 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar14;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039e210:
                iVar22 = pVVar6->nSize;
                pVVar6->nSize = iVar22 + 1;
                pVVar6->pArray[iVar22] = cVar21;
                lVar28 = lVar28 + 1;
              } while ((ulong)(iVar16 != 0) * 2 + 1 != lVar28);
              pcVar13 = Mio_GateReadPinName(pGate,iVar16);
              sVar19 = strlen(pcVar13);
              if (0 < (int)(uint)sVar19) {
                uVar29 = 0;
                do {
                  cVar21 = pcVar13[uVar29];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar27 = 0x10;
                    }
                    else {
                      sVar27 = (ulong)uVar25 * 2;
                      if ((int)sVar27 <= (int)uVar25) goto LAB_0039e2c4;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(sVar27);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar6->pArray,sVar27);
                      }
                    }
                    pVVar6->pArray = pcVar14;
                    pVVar6->nCap = (int)sVar27;
                  }
LAB_0039e2c4:
                  iVar22 = pVVar6->nSize;
                  pVVar6->nSize = iVar22 + 1;
                  pVVar6->pArray[iVar22] = cVar21;
                  uVar29 = uVar29 + 1;
                } while (((uint)sVar19 & 0x7fffffff) != uVar29);
              }
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039e34c;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,sVar19);
                  }
                }
                pVVar6->pArray = pcVar13;
                pVVar6->nCap = (int)sVar19;
              }
LAB_0039e34c:
              iVar22 = pVVar6->nSize;
              pVVar6->nSize = iVar22 + 1;
              pVVar6->pArray[iVar22] = '(';
              Bac_ManWriteSig(p,(int)pcVar12);
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039e3c7;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar6->pArray,sVar19);
                  }
                }
                pVVar6->pArray = pcVar13;
                pVVar6->nCap = (int)sVar19;
              }
LAB_0039e3c7:
              iVar22 = pVVar6->nSize;
              pVVar6->nSize = iVar22 + 1;
              pVVar6->pArray[iVar22] = ')';
              iVar16 = iVar16 + 1;
            } while (iVar16 != iVar10);
          }
          uVar29 = (ulong)(p->vType).nSize;
          if ((long)(pcVar18 + 1) < (long)uVar29) {
            pcVar12 = pcVar18 + 1;
            pcVar13 = (char *)((ulong)pcVar18 & 0xffffffff);
            do {
              pcVar14 = pcVar12;
              if ((int)pcVar13 < -1) goto LAB_003a011b;
              pcVar12 = (p->vType).pArray;
              if ((pcVar12[(long)pcVar14] & 0xfeU) != 8) break;
              if ((long)(int)uVar29 <= (long)pcVar18) goto LAB_003a011b;
              pcVar13 = pcVar18;
              if (((byte)pcVar12[(long)pcVar18] >> 1) - 0x49 < 0xffffffbc) goto LAB_003a0151;
              do {
                if ((long)pcVar13 < 1) {
                  pcVar12 = (char *)0x0;
                  goto LAB_0039e484;
                }
                pbVar1 = (byte *)(pcVar12 + -1 + (long)pcVar13);
                pcVar13 = pcVar13 + -1;
              } while ((*pbVar1 & 0xfe) == 6);
              pcVar12 = (char *)(ulong)((int)pcVar13 + 1);
LAB_0039e484:
              pcVar13 = ", .";
              if (pcVar12 == pcVar18) {
                pcVar13 = ".";
              }
              lVar28 = 0;
              do {
                cVar21 = pcVar13[lVar28];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar15 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar15 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039e501;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar15 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar15 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar15;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039e501:
                iVar16 = pVVar6->nSize;
                pVVar6->nSize = iVar16 + 1;
                pVVar6->pArray[iVar16] = cVar21;
                lVar28 = lVar28 + 1;
              } while ((ulong)(pcVar12 != pcVar18) * 2 + 1 != lVar28);
              pcVar12 = Mio_GateReadOutName(pGate);
              sVar19 = strlen(pcVar12);
              if (0 < (int)(uint)sVar19) {
                uVar29 = 0;
                do {
                  cVar21 = pcVar12[uVar29];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar27 = 0x10;
                    }
                    else {
                      sVar27 = (ulong)uVar25 * 2;
                      if ((int)sVar27 <= (int)uVar25) goto LAB_0039e5b1;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(sVar27);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar6->pArray,sVar27);
                      }
                    }
                    pVVar6->pArray = pcVar13;
                    pVVar6->nCap = (int)sVar27;
                  }
LAB_0039e5b1:
                  iVar16 = pVVar6->nSize;
                  pVVar6->nSize = iVar16 + 1;
                  pVVar6->pArray[iVar16] = cVar21;
                  uVar29 = uVar29 + 1;
                } while (((uint)sVar19 & 0x7fffffff) != uVar29);
              }
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039e639;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                  }
                }
                pVVar6->pArray = pcVar12;
                pVVar6->nCap = (int)sVar19;
              }
LAB_0039e639:
              iVar16 = pVVar6->nSize;
              pVVar6->nSize = iVar16 + 1;
              pVVar6->pArray[iVar16] = '(';
              Bac_ManWriteSig(p,(int)pcVar14);
              uVar25 = pVVar6->nCap;
              if (pVVar6->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039e6b4;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                  }
                }
                pVVar6->pArray = pcVar12;
                pVVar6->nCap = (int)sVar19;
              }
LAB_0039e6b4:
              iVar16 = pVVar6->nSize;
              pVVar6->nSize = iVar16 + 1;
              pVVar6->pArray[iVar16] = ')';
              uVar25 = (p->vType).nSize;
              uVar29 = (ulong)uVar25;
              pcVar12 = pcVar14 + 1;
              pcVar13 = pcVar14;
            } while ((int)(pcVar14 + 1) < (int)uVar25);
          }
          lVar28 = 0;
          do {
            cVar21 = "\n  );\n"[lVar28 + 3];
            uVar25 = pVVar6->nCap;
            if (pVVar6->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039e758;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar12;
              pVVar6->nCap = (int)sVar19;
            }
LAB_0039e758:
            iVar16 = pVVar6->nSize;
            pVVar6->nSize = iVar16 + 1;
            pVVar6->pArray[iVar16] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
        }
        else if ((fUseAssign == 0) || (cVar21 == '\n')) {
          iVar10 = pVVar5->nSize;
          if (cVar21 == '\n') {
            if (bVar2 < 10) goto LAB_003a0206;
            if ((long)(p->vFanin).nSize <= (long)pcVar18) goto LAB_003a018a;
            iVar22 = (p->vFanin).pArray[(long)pcVar18];
            if (((long)iVar22 < 1) || (p->pDesign->nNtks < iVar22)) {
              pBVar26 = (Bac_Ntk_t *)0x0;
            }
            else {
              pBVar26 = p->pDesign->pNtks + iVar22;
            }
            lVar28 = 0;
            do {
              cVar21 = "\nmodule %s (\n  "[lVar28 + 0xd];
              uVar25 = pVVar5->nCap;
              if (pVVar5->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039e7ee;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                  }
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar19;
              }
LAB_0039e7ee:
              iVar22 = pVVar5->nSize;
              pVVar5->nSize = iVar22 + 1;
              pVVar5->pArray[iVar22] = cVar21;
              lVar28 = lVar28 + 1;
            } while (lVar28 != 2);
            pcVar12 = Abc_NamStr(pBVar26->pDesign->pStrs,pBVar26->NameId);
            sVar19 = strlen(pcVar12);
            if (0 < (int)(uint)sVar19) {
              uVar29 = 0;
              do {
                cVar21 = pcVar12[uVar29];
                uVar25 = pVVar5->nCap;
                if (pVVar5->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar27 = 0x10;
                  }
                  else {
                    sVar27 = (ulong)uVar25 * 2;
                    if ((int)sVar27 <= (int)uVar25) goto LAB_0039e8b5;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar27);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar27);
                    }
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = (int)sVar27;
                }
LAB_0039e8b5:
                iVar22 = pVVar5->nSize;
                pVVar5->nSize = iVar22 + 1;
                pVVar5->pArray[iVar22] = cVar21;
                uVar29 = uVar29 + 1;
              } while (((uint)sVar19 & 0x7fffffff) != uVar29);
            }
            uVar25 = pVVar5->nCap;
            if (pVVar5->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039eb72;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                }
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = (int)sVar19;
            }
LAB_0039eb72:
            iVar22 = pVVar5->nSize;
            pVVar5->nSize = iVar22 + 1;
            pVVar5->pArray[iVar22] = ' ';
            iVar22 = Bac_ObjName(p,iVar16);
            pcVar12 = "";
            if (iVar22 != 0) {
              pcVar12 = Bac_ObjNameStr(p,iVar16);
            }
            sVar19 = strlen(pcVar12);
            if (0 < (int)(uint)sVar19) {
              uVar29 = 0;
              do {
                cVar21 = pcVar12[uVar29];
                uVar25 = pVVar5->nCap;
                if (pVVar5->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar27 = 0x10;
                  }
                  else {
                    sVar27 = (ulong)uVar25 * 2;
                    if ((int)sVar27 <= (int)uVar25) goto LAB_0039ec2b;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar27);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar27);
                    }
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = (int)sVar27;
                }
LAB_0039ec2b:
                iVar22 = pVVar5->nSize;
                pVVar5->nSize = iVar22 + 1;
                pVVar5->pArray[iVar22] = cVar21;
                uVar29 = uVar29 + 1;
              } while (((uint)sVar19 & 0x7fffffff) != uVar29);
            }
            lVar28 = 0;
            do {
              cVar21 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar28 + 0x24];
              uVar25 = pVVar5->nCap;
              if (pVVar5->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039ecbf;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                  }
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar19;
              }
LAB_0039ecbf:
              iVar22 = pVVar5->nSize;
              pVVar5->nSize = iVar22 + 1;
              pVVar5->pArray[iVar22] = cVar21;
              lVar28 = lVar28 + 1;
            } while (lVar28 != 2);
            if ((pBVar26->vInfo).nSize + 2U < 5) {
              __assert_fail("Bac_NtkInfoNum(pModel)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x1fa,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            iVar22 = 0;
            local_74 = 0;
            if (2 < (pBVar26->vInfo).nSize) {
              local_74 = 0;
              iVar22 = 0;
              lVar28 = 0;
              do {
                piVar7 = (pBVar26->vInfo).pArray;
                uVar25 = piVar7[lVar28];
                if ((int)uVar25 < 0) {
                  pcVar18 = "iLit >= 0";
                  pcVar13 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ;
                  pcVar12 = "int Abc_Lit2Var2(int)";
                  goto LAB_003a021b;
                }
                iVar23 = piVar7[lVar28 + 1];
                iVar11 = piVar7[lVar28 + 2];
                if (lVar28 != 0) {
                  lVar30 = 0;
                  do {
                    cVar21 = "    \"%s\", "[lVar30 + 8];
                    uVar3 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar3) {
                      if ((int)uVar3 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar19 = 0x10;
                      }
                      else {
                        sVar19 = (ulong)uVar3 * 2;
                        if ((int)sVar19 <= (int)uVar3) goto LAB_0039edda;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(sVar19);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                        }
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar19;
                    }
LAB_0039edda:
                    iVar4 = pVVar5->nSize;
                    pVVar5->nSize = iVar4 + 1;
                    pVVar5->pArray[iVar4] = cVar21;
                    lVar30 = lVar30 + 1;
                  } while (lVar30 != 2);
                }
                iVar4 = pVVar5->nSize;
                if (iVar10 + 0x46 < iVar4) {
                  lVar30 = 0;
                  do {
                    cVar21 = "module %s (\n    "[lVar30 + 0xb];
                    uVar3 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar3) {
                      if ((int)uVar3 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar19 = 0x10;
                      }
                      else {
                        sVar19 = (ulong)uVar3 * 2;
                        if ((int)sVar19 <= (int)uVar3) goto LAB_0039ee7f;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(sVar19);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                        }
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar19;
                    }
LAB_0039ee7f:
                    iVar10 = pVVar5->nSize;
                    pVVar5->nSize = iVar10 + 1;
                    pVVar5->pArray[iVar10] = cVar21;
                    lVar30 = lVar30 + 1;
                    iVar10 = iVar4;
                  } while (lVar30 != 5);
                }
                uVar3 = pVVar5->nCap;
                if (pVVar5->nSize == uVar3) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar3 * 2;
                    if ((int)sVar19 <= (int)uVar3) goto LAB_0039ef16;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                    }
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar19;
                }
LAB_0039ef16:
                iVar4 = pVVar5->nSize;
                pVVar5->nSize = iVar4 + 1;
                pVVar5->pArray[iVar4] = '.';
                pcVar12 = Abc_NamStr(p->pDesign->pStrs,uVar25 >> 2);
                sVar19 = strlen(pcVar12);
                if (0 < (int)(uint)sVar19) {
                  uVar29 = 0;
                  do {
                    cVar21 = pcVar12[uVar29];
                    uVar3 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar3) {
                      if ((int)uVar3 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar13 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar27 = 0x10;
                      }
                      else {
                        sVar27 = (ulong)uVar3 * 2;
                        if ((int)sVar27 <= (int)uVar3) goto LAB_0039efc4;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar13 = (char *)malloc(sVar27);
                        }
                        else {
                          pcVar13 = (char *)realloc(pVVar5->pArray,sVar27);
                        }
                      }
                      pVVar5->pArray = pcVar13;
                      pVVar5->nCap = (int)sVar27;
                    }
LAB_0039efc4:
                    iVar4 = pVVar5->nSize;
                    pVVar5->nSize = iVar4 + 1;
                    pVVar5->pArray[iVar4] = cVar21;
                    uVar29 = uVar29 + 1;
                  } while (((uint)sVar19 & 0x7fffffff) != uVar29);
                }
                uVar3 = pVVar5->nCap;
                if (pVVar5->nSize == uVar3) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar3 * 2;
                    if ((int)sVar19 <= (int)uVar3) goto LAB_0039f04f;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                    }
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar19;
                }
LAB_0039f04f:
                iVar4 = pVVar5->nSize;
                pVVar5->nSize = iVar4 + 1;
                pVVar5->pArray[iVar4] = '(';
                iVar11 = iVar11 - iVar23;
                iVar23 = -iVar11;
                if (0 < iVar11) {
                  iVar23 = iVar11;
                }
                iVar23 = iVar23 + 1;
                if ((uVar25 & 3) == 2) {
                  if ((long)(p->vType).nSize <= (long)pcVar18) goto LAB_003a011b;
                  if (((byte)(p->vType).pArray[(long)pcVar18] >> 1) - 0x49 < 0xffffffbc) {
                    __assert_fail("Bac_ObjIsBox(p, b)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
                  }
                  Bac_ManWriteConcat(p,iVar16 + 1 + iVar22,iVar23);
                  iVar22 = iVar23 + iVar22;
                }
                else {
                  if ((uVar25 & 3) != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                  ,0x20e,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
                  }
                  if ((long)(p->vType).nSize <= (long)pcVar18) goto LAB_003a011b;
                  if (((byte)(p->vType).pArray[(long)pcVar18] >> 1) - 0x49 < 0xffffffbc) {
                    __assert_fail("Bac_ObjIsBox(p, b)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
                  }
                  Bac_ManWriteConcat(p,~local_74 + iVar16,iVar23);
                  local_74 = local_74 + iVar23;
                }
                uVar25 = pVVar5->nCap;
                if (pVVar5->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039f17c;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                    }
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar19;
                }
LAB_0039f17c:
                iVar23 = pVVar5->nSize;
                pVVar5->nSize = iVar23 + 1;
                pVVar5->pArray[iVar23] = ')';
                iVar23 = (int)lVar28;
                lVar28 = lVar28 + 3;
              } while (iVar23 + 5 < (pBVar26->vInfo).nSize);
            }
            iVar10 = (p->vType).nSize;
            if ((long)iVar10 <= (long)pcVar18) {
LAB_003a011b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pcVar12 = (p->vType).pArray;
            pcVar13 = pcVar18;
            if (((byte)pcVar12[(long)pcVar18] >> 1) - 0x49 < 0xffffffbc) goto LAB_003a0151;
            do {
              if ((long)pcVar13 < 1) {
                iVar23 = 0;
                goto LAB_0039f20e;
              }
              pbVar1 = (byte *)(pcVar12 + -1 + (long)pcVar13);
              pcVar13 = pcVar13 + -1;
            } while ((*pbVar1 & 0xfe) == 6);
            iVar23 = (int)pcVar13 + 1;
LAB_0039f20e:
            if (local_74 != iVar16 - iVar23) {
              __assert_fail("i == Bac_BoxBiNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x211,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            lVar28 = local_50;
            iVar23 = local_5c;
            do {
              iVar11 = iVar10 + -1;
              if (iVar10 <= lVar28) break;
              pbVar1 = (byte *)(pcVar12 + lVar28);
              iVar23 = iVar23 + 1;
              lVar28 = lVar28 + 1;
              iVar11 = iVar23;
            } while ((*pbVar1 & 0xfe) == 8);
            if (iVar22 != iVar11 - iVar16) {
              __assert_fail("o == Bac_BoxBoNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x212,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          else {
            DAT_00cb3328 = &Bac_BoxCollectRanges_pArray;
            _Bac_BoxCollectRanges_Bits = 10;
            pcVar13 = pcVar18;
            if (pcVar18 != (char *)0x0) {
              do {
                if ((long)(p->vType).nSize < (long)pcVar13) goto LAB_003a011b;
                pcVar14 = pcVar13 + -1;
                pcVar15 = (p->vType).pArray;
                bVar2 = pcVar15[(long)pcVar14];
                pcVar12 = (char *)CONCAT71((int7)((ulong)pcVar12 >> 8),bVar2);
                uVar29 = (ulong)pcVar12 & 0xfffffffe;
                if ((char)uVar29 != '\x06') break;
                if ((char)bVar2 < '\0') goto LAB_003a013a;
                pcVar17 = pcVar14;
                if ((bVar2 & 1) == 0) {
                  do {
                    if ((long)pcVar17 < 1) {
                      pcVar12 = (char *)0xffffffff;
                      break;
                    }
                    bVar2 = (pcVar15 + -1)[(long)pcVar17];
                    uVar29 = CONCAT71((int7)(uVar29 >> 8),bVar2);
                    uVar24 = uVar29 & 0xfffffffffffffffe;
                    if ((char)uVar24 != '\x06') {
                      pcVar12 = (char *)(ulong)((int)pcVar17 - 1);
                      break;
                    }
                    if ((char)bVar2 < '\0') goto LAB_003a013a;
                    pcVar12 = pcVar17 + -1;
                    pcVar17 = pcVar12;
                  } while ((bVar2 & 1) != 0);
                  Vec_IntPush((Vec_Int_t *)(ulong)(uint)((int)pcVar14 - (int)pcVar12),(int)uVar24);
                }
                bVar8 = 1 < (long)pcVar13;
                pcVar13 = pcVar14;
              } while (bVar8);
            }
            pcVar12 = pcVar18 + 1;
            uVar29 = (ulong)(p->vType).nSize;
            pcVar13 = pcVar18;
            if ((long)pcVar12 < (long)uVar29) {
              do {
                iVar22 = (int)uVar29;
                if ((int)pcVar13 < -1) goto LAB_003a011b;
                pcVar14 = (p->vType).pArray;
                bVar2 = pcVar14[(long)pcVar12];
                if ((bVar2 & 0xfe) != 8) break;
                if ((char)bVar2 < '\0') goto LAB_003a013a;
                pcVar15 = pcVar13;
                pcVar17 = pcVar12;
                if ((bVar2 & 1) == 0) {
                  do {
                    iVar23 = (int)pcVar15 + 2;
                    if (iVar22 <= iVar23) goto LAB_0039da71;
                    bVar2 = (pcVar14 + 2)[(long)pcVar15];
                    iVar23 = CONCAT31((int3)((uint)iVar23 >> 8),bVar2);
                    if ((bVar2 & 0xfe) != 8) {
                      iVar22 = (int)pcVar15 + 2;
                      goto LAB_0039da71;
                    }
                    if ((char)bVar2 < '\0') goto LAB_003a013a;
                    pcVar17 = pcVar17 + 1;
                    pcVar15 = pcVar15 + 1;
                  } while ((bVar2 & 1) != 0);
                  iVar22 = (int)pcVar17;
LAB_0039da71:
                  Vec_IntPush((Vec_Int_t *)(ulong)(uint)(iVar22 - (int)pcVar12),iVar23);
                }
                pcVar12 = pcVar12 + 1;
                uVar25 = (p->vType).nSize;
                uVar29 = (ulong)uVar25;
                pcVar13 = pcVar13 + 1;
              } while ((int)pcVar12 < (int)uVar25);
            }
            if (9 < (int)DAT_00cb3324) {
              __assert_fail("Vec_IntSize(vBits) < 10",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x1ef,"Vec_Int_t *Bac_BoxCollectRanges(Bac_Ntk_t *, int)");
            }
            if (((long)(p->vType).nSize <= (long)pcVar18) ||
               (pcVar12 = Bac_NtkGenerateName(p,(uint)((byte)(p->vType).pArray[(long)pcVar18] >> 1),
                                              (Vec_Int_t *)&Bac_BoxCollectRanges_Bits),
               (long)(p->vType).nSize <= (long)pcVar18)) goto LAB_003a011b;
            lVar28 = *(long *)((long)p->pDesign->pPrimSymbs +
                              (ulong)((byte)(p->vType).pArray[(long)pcVar18] & 0xfffffffe) * 4);
            lVar30 = 0;
            do {
              cVar21 = "\nmodule %s (\n  "[lVar30 + 0xd];
              uVar25 = pVVar5->nCap;
              if (pVVar5->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039db54;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar5->pArray,sVar19);
                  }
                }
                pVVar5->pArray = pcVar13;
                pVVar5->nCap = (int)sVar19;
              }
LAB_0039db54:
              iVar22 = pVVar5->nSize;
              pVVar5->nSize = iVar22 + 1;
              pVVar5->pArray[iVar22] = cVar21;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 2);
            sVar19 = strlen(pcVar12);
            if (0 < (int)(uint)sVar19) {
              uVar29 = 0;
              do {
                cVar21 = pcVar12[uVar29];
                uVar25 = pVVar5->nCap;
                if (pVVar5->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar27 = 0x10;
                  }
                  else {
                    sVar27 = (ulong)uVar25 * 2;
                    if ((int)sVar27 <= (int)uVar25) goto LAB_0039debb;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar27);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar27);
                    }
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = (int)sVar27;
                }
LAB_0039debb:
                iVar22 = pVVar5->nSize;
                pVVar5->nSize = iVar22 + 1;
                pVVar5->pArray[iVar22] = cVar21;
                uVar29 = uVar29 + 1;
              } while (((uint)sVar19 & 0x7fffffff) != uVar29);
            }
            uVar25 = pVVar5->nCap;
            if (pVVar5->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039f274;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                }
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = (int)sVar19;
            }
LAB_0039f274:
            iVar22 = pVVar5->nSize;
            pVVar5->nSize = iVar22 + 1;
            pVVar5->pArray[iVar22] = ' ';
            iVar22 = Bac_ObjName(p,iVar16);
            pcVar12 = "";
            if (iVar22 != 0) {
              pcVar12 = Bac_ObjNameStr(p,iVar16);
            }
            sVar19 = strlen(pcVar12);
            if (0 < (int)(uint)sVar19) {
              uVar29 = 0;
              do {
                cVar21 = pcVar12[uVar29];
                uVar25 = pVVar5->nCap;
                if (pVVar5->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    sVar27 = 0x10;
                  }
                  else {
                    sVar27 = (ulong)uVar25 * 2;
                    if ((int)sVar27 <= (int)uVar25) goto LAB_0039f32d;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar27);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar27);
                    }
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = (int)sVar27;
                }
LAB_0039f32d:
                iVar16 = pVVar5->nSize;
                pVVar5->nSize = iVar16 + 1;
                pVVar5->pArray[iVar16] = cVar21;
                uVar29 = uVar29 + 1;
              } while (((uint)sVar19 & 0x7fffffff) != uVar29);
            }
            lVar30 = 0;
            do {
              cVar21 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar30 + 0x24];
              uVar25 = pVVar5->nCap;
              if (pVVar5->nSize == uVar25) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar25 * 2;
                  if ((int)sVar19 <= (int)uVar25) goto LAB_0039f3c1;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                  }
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar19;
              }
LAB_0039f3c1:
              iVar16 = pVVar5->nSize;
              pVVar5->nSize = iVar16 + 1;
              pVVar5->pArray[iVar16] = cVar21;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 2);
            if (pcVar18 == (char *)0x0) {
              uVar25 = 0;
            }
            else {
              uVar25 = 0;
              pcVar12 = pcVar18;
              do {
                if ((p->vType).nSize < (int)pcVar12) goto LAB_003a011b;
                pcVar13 = pcVar12 + -1;
                bVar2 = (p->vType).pArray[(ulong)pcVar13 & 0xffffffff];
                if ((bVar2 & 0xfe) != 6) break;
                if ((char)bVar2 < '\0') goto LAB_003a013a;
                if ((bVar2 & 1) == 0) {
                  if (((int)uVar25 < 0) || ((int)DAT_00cb3324 <= (int)uVar25)) goto LAB_003a018a;
                  iVar16 = DAT_00cb3328[uVar25];
                  if (uVar25 != 0) {
                    lVar30 = 0;
                    do {
                      cVar21 = "    \"%s\", "[lVar30 + 8];
                      uVar3 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar3) {
                        if ((int)uVar3 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar14 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar19 = 0x10;
                        }
                        else {
                          sVar19 = (ulong)uVar3 * 2;
                          if ((int)sVar19 <= (int)uVar3) goto LAB_0039f4db;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar14 = (char *)malloc(sVar19);
                          }
                          else {
                            pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                          }
                        }
                        pVVar5->pArray = pcVar14;
                        pVVar5->nCap = (int)sVar19;
                      }
LAB_0039f4db:
                      iVar22 = pVVar5->nSize;
                      pVVar5->nSize = iVar22 + 1;
                      pVVar5->pArray[iVar22] = cVar21;
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != 2);
                  }
                  iVar22 = pVVar5->nSize;
                  if (iVar10 + 0x46 < iVar22) {
                    lVar30 = 0;
                    do {
                      cVar21 = "module %s (\n    "[lVar30 + 0xb];
                      uVar3 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar3) {
                        if ((int)uVar3 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar14 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar19 = 0x10;
                        }
                        else {
                          sVar19 = (ulong)uVar3 * 2;
                          if ((int)sVar19 <= (int)uVar3) goto LAB_0039f580;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar14 = (char *)malloc(sVar19);
                          }
                          else {
                            pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                          }
                        }
                        pVVar5->pArray = pcVar14;
                        pVVar5->nCap = (int)sVar19;
                      }
LAB_0039f580:
                      iVar10 = pVVar5->nSize;
                      pVVar5->nSize = iVar10 + 1;
                      pVVar5->pArray[iVar10] = cVar21;
                      lVar30 = lVar30 + 1;
                      iVar10 = iVar22;
                    } while (lVar30 != 5);
                  }
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039f612;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar14;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039f612:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = '.';
                  cVar21 = *(char *)(lVar28 + (ulong)uVar25);
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar14;
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039f6ad;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                      pVVar5->pArray = pcVar14;
                    }
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039f6ad:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = cVar21;
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039f71e;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar14;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039f71e:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = '(';
                  Bac_ManWriteConcat(p,(int)pcVar13,iVar16);
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039f7a1;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar14 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar14 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar14;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039f7a1:
                  iVar16 = pVVar5->nSize;
                  pVVar5->nSize = iVar16 + 1;
                  pVVar5->pArray[iVar16] = ')';
                  uVar25 = uVar25 + 1;
                }
                bVar8 = 1 < (long)pcVar12;
                pcVar12 = pcVar13;
              } while (bVar8);
            }
            lVar30 = local_50;
            if ((long)(pcVar18 + 1) < (long)(p->vType).nSize) {
              do {
                bVar2 = (p->vType).pArray[lVar30];
                if ((bVar2 & 0xfe) != 8) break;
                if ((char)bVar2 < '\0') goto LAB_003a013a;
                if ((bVar2 & 1) == 0) {
                  if (((int)uVar25 < 0) || ((int)DAT_00cb3324 <= (int)uVar25)) goto LAB_003a018a;
                  iVar16 = DAT_00cb3328[uVar25];
                  if (uVar25 != 0) {
                    lVar20 = 0;
                    do {
                      cVar21 = "    \"%s\", "[lVar20 + 8];
                      uVar3 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar3) {
                        if ((int)uVar3 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar19 = 0x10;
                        }
                        else {
                          sVar19 = (ulong)uVar3 * 2;
                          if ((int)sVar19 <= (int)uVar3) goto LAB_0039f8d7;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(sVar19);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                          }
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = (int)sVar19;
                      }
LAB_0039f8d7:
                      iVar22 = pVVar5->nSize;
                      pVVar5->nSize = iVar22 + 1;
                      pVVar5->pArray[iVar22] = cVar21;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 2);
                  }
                  iVar22 = pVVar5->nSize;
                  if (iVar10 + 0x46 < iVar22) {
                    lVar20 = 0;
                    do {
                      cVar21 = "module %s (\n    "[lVar20 + 0xb];
                      uVar3 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar3) {
                        if ((int)uVar3 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar19 = 0x10;
                        }
                        else {
                          sVar19 = (ulong)uVar3 * 2;
                          if ((int)sVar19 <= (int)uVar3) goto LAB_0039f97c;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(sVar19);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                          }
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = (int)sVar19;
                      }
LAB_0039f97c:
                      iVar10 = pVVar5->nSize;
                      pVVar5->nSize = iVar10 + 1;
                      pVVar5->pArray[iVar10] = cVar21;
                      lVar20 = lVar20 + 1;
                      iVar10 = iVar22;
                    } while (lVar20 != 5);
                  }
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039fa0e;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039fa0e:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = '.';
                  cVar21 = *(char *)(lVar28 + (ulong)uVar25);
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039faa4;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                      pVVar5->pArray = pcVar12;
                    }
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039faa4:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = cVar21;
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039fb15;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039fb15:
                  iVar22 = pVVar5->nSize;
                  pVVar5->nSize = iVar22 + 1;
                  pVVar5->pArray[iVar22] = '(';
                  Bac_ManWriteConcat(p,(int)lVar30,iVar16);
                  uVar3 = pVVar5->nCap;
                  if (pVVar5->nSize == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar3 * 2;
                      if ((int)sVar19 <= (int)uVar3) goto LAB_0039fb98;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                      }
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = (int)sVar19;
                  }
LAB_0039fb98:
                  iVar16 = pVVar5->nSize;
                  pVVar5->nSize = iVar16 + 1;
                  pVVar5->pArray[iVar16] = ')';
                  uVar25 = uVar25 + 1;
                }
                lVar30 = lVar30 + 1;
              } while ((int)lVar30 < (p->vType).nSize);
            }
            if (uVar25 != DAT_00cb3324) {
              __assert_fail("iSig == Vec_IntSize(vBits)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x240,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          lVar28 = 0;
          do {
            cVar21 = "\n  );\n"[lVar28 + 3];
            uVar25 = pVVar5->nCap;
            if (pVVar5->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_0039fc58;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar19);
                }
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = (int)sVar19;
            }
LAB_0039fc58:
            iVar16 = pVVar5->nSize;
            pVVar5->nSize = iVar16 + 1;
            pVVar5->pArray[iVar16] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
        }
        else {
          if (uVar25 - 0x49 < 0xffffffbc) {
LAB_003a0151:
            pcVar18 = "!Bac_ObjIsBox(p, i)";
            pcVar13 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h";
            pcVar12 = "int Bac_BoxBiNum(Bac_Ntk_t *, int)";
            goto LAB_003a0166;
          }
          pVVar6 = p->pDesign->vOut;
          iVar10 = (int)uVar29;
          pcVar13 = pcVar18;
          do {
            if ((long)pcVar13 < 1) {
              iVar22 = 0;
              goto LAB_0039db80;
            }
            if ((long)iVar10 < (long)pcVar18) goto LAB_003a011b;
            pbVar1 = (byte *)(pcVar12 + -1 + (long)pcVar13);
            pcVar13 = pcVar13 + -1;
          } while ((*pbVar1 & 0xfe) == 6);
          iVar22 = (int)pcVar13 + 1;
LAB_0039db80:
          lVar28 = local_50;
          iVar23 = local_5c;
          do {
            iVar11 = iVar10 + -1;
            if (iVar10 <= lVar28) break;
            pbVar1 = (byte *)(pcVar12 + lVar28);
            iVar23 = iVar23 + 1;
            lVar28 = lVar28 + 1;
            iVar11 = iVar23;
          } while ((*pbVar1 & 0xfe) == 8);
          if (iVar11 - iVar16 != 1) {
            __assert_fail("nOutputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x1ad,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
          }
          lVar28 = 0;
          do {
            cVar21 = "  assign "[lVar28];
            uVar3 = pVVar6->nCap;
            if (pVVar6->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar3 * 2;
                if ((int)sVar19 <= (int)uVar3) goto LAB_0039dc23;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar12;
              pVVar6->nCap = (int)sVar19;
            }
LAB_0039dc23:
            iVar10 = pVVar6->nSize;
            pVVar6->nSize = iVar10 + 1;
            pVVar6->pArray[iVar10] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 9);
          Bac_ManWriteSig(p,iVar16 + 1);
          lVar28 = 0;
          do {
            cVar21 = "Const0 (%d) = "[lVar28 + 0xb];
            uVar3 = pVVar6->nCap;
            if (pVVar6->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar3 * 2;
                if ((int)sVar19 <= (int)uVar3) goto LAB_0039dccb;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar12;
              pVVar6->nCap = (int)sVar19;
            }
LAB_0039dccb:
            iVar10 = pVVar6->nSize;
            pVVar6->nSize = iVar10 + 1;
            pVVar6->pArray[iVar10] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          if (iVar16 - iVar22 == 2) {
            if ((bVar9 < 0x14) && ((0xaa000U >> (uVar25 & 0x1f) & 1) != 0)) {
              uVar3 = pVVar6->nCap;
              if (pVVar6->nSize == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar3 * 2;
                  if ((int)sVar19 <= (int)uVar3) goto LAB_0039fcde;
                  if (pVVar6->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                  }
                }
                pVVar6->pArray = pcVar12;
                pVVar6->nCap = (int)sVar19;
              }
LAB_0039fcde:
              iVar10 = pVVar6->nSize;
              pVVar6->nSize = iVar10 + 1;
              pVVar6->pArray[iVar10] = '~';
            }
            Bac_ManWriteSig(p,iVar16 + -1);
            switch(uVar25) {
            case 0xc:
            case 0x13:
              lVar28 = 0;
              do {
                cVar21 = " := %s & "[lVar28 + 6];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039fd84;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039fd84:
                iVar10 = pVVar6->nSize;
                pVVar6->nSize = iVar10 + 1;
                pVVar6->pArray[iVar10] = cVar21;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 3);
              break;
            case 0xd:
              lVar28 = 0;
              do {
                cVar21 = " | ~"[lVar28];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039ffca;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039ffca:
                iVar10 = pVVar6->nSize;
                pVVar6->nSize = iVar10 + 1;
                pVVar6->pArray[iVar10] = cVar21;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 4);
              break;
            case 0xe:
              lVar28 = 0;
              do {
                cVar21 = "All%d =%10d | "[lVar28 + 0xb];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039ff3c;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039ff3c:
                iVar10 = pVVar6->nSize;
                pVVar6->nSize = iVar10 + 1;
                pVVar6->pArray[iVar10] = cVar21;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 3);
              break;
            case 0xf:
            case 0x12:
              lVar28 = 0;
              do {
                cVar21 = " & ~"[lVar28];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039fe12;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039fe12:
                iVar10 = pVVar6->nSize;
                pVVar6->nSize = iVar10 + 1;
                pVVar6->pArray[iVar10] = cVar21;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 4);
              break;
            default:
              if ((uVar25 & 0xfffffffe) != 0x10) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x1d3,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
              }
              lVar28 = 0;
              do {
                cVar21 = " ^ "[lVar28];
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_0039feae;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_0039feae:
                iVar10 = pVVar6->nSize;
                pVVar6->nSize = iVar10 + 1;
                pVVar6->pArray[iVar10] = cVar21;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 3);
            }
            iVar10 = -2;
LAB_003a0023:
            Bac_ManWriteSig(p,iVar16 + iVar10);
          }
          else {
            if (iVar16 - iVar22 == 1) {
              iVar10 = -1;
              if (bVar9 != 10) {
                if (uVar25 != 0xb) {
                  __assert_fail("Type == BAC_BOX_BUF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                ,0x1c1,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
                }
                uVar25 = pVVar6->nCap;
                if (pVVar6->nSize == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar25 * 2;
                    if ((int)sVar19 <= (int)uVar25) goto LAB_003a0010;
                    if (pVVar6->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                    }
                  }
                  pVVar6->pArray = pcVar12;
                  pVVar6->nCap = (int)sVar19;
                }
LAB_003a0010:
                iVar22 = pVVar6->nSize;
                pVVar6->nSize = iVar22 + 1;
                pVVar6->pArray[iVar22] = '~';
              }
              goto LAB_003a0023;
            }
            if (iVar16 == iVar22) {
              switch(uVar25) {
              case 6:
                lVar28 = 0;
                do {
                  cVar21 = "1\'b0"[lVar28];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar25 * 2;
                      if ((int)sVar19 <= (int)uVar25) goto LAB_0039dd9e;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                      }
                    }
                    pVVar6->pArray = pcVar12;
                    pVVar6->nCap = (int)sVar19;
                  }
LAB_0039dd9e:
                  iVar16 = pVVar6->nSize;
                  pVVar6->nSize = iVar16 + 1;
                  pVVar6->pArray[iVar16] = cVar21;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 4);
                break;
              case 7:
                lVar28 = 0;
                do {
                  cVar21 = "1\'b1"[lVar28];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar25 * 2;
                      if ((int)sVar19 <= (int)uVar25) goto LAB_0039eb02;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                      }
                    }
                    pVVar6->pArray = pcVar12;
                    pVVar6->nCap = (int)sVar19;
                  }
LAB_0039eb02:
                  iVar16 = pVVar6->nSize;
                  pVVar6->nSize = iVar16 + 1;
                  pVVar6->pArray[iVar16] = cVar21;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 4);
                break;
              case 8:
                lVar28 = 0;
                do {
                  cVar21 = "1\'bx"[lVar28];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar25 * 2;
                      if ((int)sVar19 <= (int)uVar25) goto LAB_0039e9d4;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                      }
                    }
                    pVVar6->pArray = pcVar12;
                    pVVar6->nCap = (int)sVar19;
                  }
LAB_0039e9d4:
                  iVar16 = pVVar6->nSize;
                  pVVar6->nSize = iVar16 + 1;
                  pVVar6->pArray[iVar16] = cVar21;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 4);
                break;
              case 9:
                lVar28 = 0;
                do {
                  cVar21 = "1\'bz"[lVar28];
                  uVar25 = pVVar6->nCap;
                  if (pVVar6->nSize == uVar25) {
                    if ((int)uVar25 < 0x10) {
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                      }
                      sVar19 = 0x10;
                    }
                    else {
                      sVar19 = (ulong)uVar25 * 2;
                      if ((int)sVar19 <= (int)uVar25) goto LAB_0039ea6b;
                      if (pVVar6->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar19);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                      }
                    }
                    pVVar6->pArray = pcVar12;
                    pVVar6->nCap = (int)sVar19;
                  }
LAB_0039ea6b:
                  iVar16 = pVVar6->nSize;
                  pVVar6->nSize = iVar16 + 1;
                  pVVar6->pArray[iVar16] = cVar21;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 4);
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x1bb,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
              }
            }
          }
          lVar28 = 0;
          do {
            cVar21 = " .%s(%s) ) ;\n"[lVar28 + 0xb];
            uVar25 = pVVar6->nCap;
            if (pVVar6->nSize == uVar25) {
              if ((int)uVar25 < 0x10) {
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar25 * 2;
                if ((int)sVar19 <= (int)uVar25) goto LAB_003a00a6;
                if (pVVar6->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar19);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar6->pArray,sVar19);
                }
              }
              pVVar6->pArray = pcVar12;
              pVVar6->nCap = (int)sVar19;
            }
LAB_003a00a6:
            iVar16 = pVVar6->nSize;
            pVVar6->nSize = iVar16 + 1;
            pVVar6->pArray[iVar16] = cVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 2);
        }
      }
      pcVar18 = pcVar18 + 1;
      uVar29 = (ulong)(p->vType).nSize;
      local_50 = local_50 + 1;
      local_5c = local_5c + 1;
    } while ((long)pcVar18 < (long)uVar29);
  }
  return;
LAB_003a013a:
  pcVar18 = "iLit >= 0";
  pcVar13 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h";
  pcVar12 = "int Abc_LitIsCompl(int)";
LAB_003a0166:
  __assert_fail(pcVar18 + 1,pcVar13,0x130,pcVar12);
}

Assistant:

void Bac_ManWriteVerilogBoxes( Bac_Ntk_t * p, int fUseAssign )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int iObj, k, i, o, StartPos;
    Bac_NtkForEachBox( p, iObj ) // .subckt/.gate/box (formal/actual binding) 
    {
        // skip constants
        if ( Bac_ObjIsConst(p, iObj) )
            continue;
        // write mapped
        if ( Bac_ObjIsGate(p, iObj) )
        {
            Bac_ManWriteGate( p, iObj );
            continue;
        }
        // write primitives as assign-statements
        if ( !Bac_ObjIsBoxUser(p, iObj) && fUseAssign )
        {
            Bac_ManWriteAssign( p, iObj );
            continue;
        }
        // write header
        StartPos = Vec_StrSize(vStr);
        if ( Bac_ObjIsBoxUser(p, iObj) )
        {
            int Value, Beg, End, Range;
            Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, Bac_NtkName(pModel) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write arguments
            i = o = 0;
            assert( Bac_NtkInfoNum(pModel) );
            Vec_IntForEachEntryTriple( &pModel->vInfo, Value, Beg, End, k )
            {
                int NameId = Abc_Lit2Var2( Value );
                int Type = Abc_Lit2Att2( Value );
                Vec_StrPrintStr( vStr, k ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPrintStr( vStr, Bac_NtkStr(p, NameId) );
                Vec_StrPrintStr( vStr, "(" );
                Range = Bac_InfoRange( Beg, End );
                assert( Range > 0 );
                if ( Type == 1 )
                    Bac_ManWriteConcat( p, Bac_BoxBi(p, iObj, i), Range ), i += Range;
                else if ( Type == 2 )
                    Bac_ManWriteConcat( p, Bac_BoxBo(p, iObj, o), Range ), o += Range;
                else assert( 0 );
                Vec_StrPrintStr( vStr, ")" );
            }
            assert( i == Bac_BoxBiNum(p, iObj) );
            assert( o == Bac_BoxBoNum(p, iObj) );
        }
        else
        {
            int iTerm, k, Range, iSig = 0;
            Vec_Int_t * vBits = Bac_BoxCollectRanges( p, iObj );
            char * pName = Bac_NtkGenerateName( p, Bac_ObjType(p, iObj), vBits );
            char * pSymbs = Bac_ManPrimSymb( p->pDesign, Bac_ObjType(p, iObj) );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, pName );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write inputs
            Bac_BoxForEachBiMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            Bac_BoxForEachBoMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            assert( iSig == Vec_IntSize(vBits) );
        }
        Vec_StrPrintStr( vStr, ");\n" );
    }
}